

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::PointLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,PointLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  Float a;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar1;
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar10;
  Point3<float> PVar11;
  Vector3f VVar12;
  Tuple2<pbrt::Point2,_float> local_d8;
  SampledSpectrum local_d0;
  LightLeSample local_c0;
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_c0.L.values.values[3] = local_c0.L.values.values[1];
  local_c0.L.values.values._0_12_ = ZEXT812(0);
  local_d8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2._0_16_);
  PVar11 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Point3<float> *)&local_c0);
  auVar3._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = in_register_00001208;
  VVar12 = SampleUniformSphere((Point2f *)&local_d8);
  auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = in_register_00001208;
  a = this->scale;
  auVar7 = (undefined1  [56])0x0;
  TVar1.bits = (this->super_LightBase).mediumInterface.outside.
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               .bits;
  SVar10 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar8._0_8_ = SVar10.values.values._8_8_;
  auVar8._8_56_ = in_register_00001248;
  auVar5._0_8_ = SVar10.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  local_d0.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar8._0_16_);
  auVar7 = (undefined1  [56])0x0;
  SVar10 = SampledSpectrum::operator*(&local_d0,a);
  auVar9._0_8_ = SVar10.values.values._8_8_;
  auVar9._8_56_ = in_register_00001248;
  auVar6._0_8_ = SVar10.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  local_c0.L.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  local_c0.ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3._0_16_);
  local_c0.ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_c0.intr.set = false;
  local_c0.pdfPos = 1.0;
  local_c0.pdfDir = 0.07957747;
  local_c0.ray.o.super_Tuple3<pbrt::Point3,_float>.z = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
  local_c0.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c0.ray.time = time;
  local_c0.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )TVar1.bits;
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_c0);
  pstd::optional<pbrt::Interaction>::~optional(&local_c0.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> PointLight::SampleLe(Point2f u1, Point2f u2,
                                                   SampledWavelengths &lambda,
                                                   Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}